

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O0

tool_mime *
tool_mime_new_filedata(tool_mime *parent,char *filename,_Bool isremotefile,CURLcode *errcode)

{
  int iVar1;
  ParameterError PVar2;
  size_t local_100;
  size_t stdinsize;
  stat sbuf;
  curl_off_t origin;
  curl_off_t size;
  char *data;
  char *pcStack_48;
  int fd;
  char *filedup;
  tool_mime *m;
  CURLcode *pCStack_30;
  CURLcode result;
  CURLcode *errcode_local;
  char *pcStack_20;
  _Bool isremotefile_local;
  char *filename_local;
  tool_mime *parent_local;
  
  m._4_4_ = CURLE_OK;
  filedup = (char *)0x0;
  *errcode = CURLE_OUT_OF_MEMORY;
  pCStack_30 = errcode;
  errcode_local._7_1_ = isremotefile;
  pcStack_20 = filename;
  filename_local = (char *)parent;
  iVar1 = strcmp(filename,"-");
  if (iVar1 == 0) {
    data._4_4_ = fileno(_stdin);
    size = 0;
    sbuf.__glibc_reserved[2] = ftell(_stdin);
    if ((((data._4_4_ < 0) || (sbuf.__glibc_reserved[2] < 0)) ||
        (iVar1 = fstat64(data._4_4_,(stat64 *)&stdinsize), iVar1 != 0)) ||
       (((uint)sbuf.st_nlink & 0xf000) != 0x8000)) {
      local_100 = 0;
      PVar2 = file2memory((char **)&size,&local_100,(FILE *)_stdin);
      if (PVar2 == PARAM_NO_MEM) {
        return (tool_mime *)filedup;
      }
      if (PVar2 == PARAM_READ_ERROR) {
        m._4_4_ = CURLE_READ_ERROR;
      }
      else if ((local_100 == 0) && (size = (curl_off_t)strdup(""), (char *)size == (char *)0x0)) {
        return (tool_mime *)filedup;
      }
      origin = uztoso(local_100);
      sbuf.__glibc_reserved[2] = 0;
    }
    else {
      origin = sbuf.st_rdev - sbuf.__glibc_reserved[2];
      if (origin < 0) {
        origin = 0;
      }
    }
    filedup = (char *)tool_mime_new((tool_mime *)filename_local,TOOLMIME_STDIN);
    if ((tool_mime *)filedup == (tool_mime *)0x0) {
      free((void *)size);
    }
    else {
      ((tool_mime *)filedup)->data = (char *)size;
      ((tool_mime *)filedup)->origin = sbuf.__glibc_reserved[2];
      ((tool_mime *)filedup)->size = origin;
      ((tool_mime *)filedup)->curpos = 0;
      if ((errcode_local._7_1_ & 1) == 0) {
        ((tool_mime *)filedup)->kind = TOOLMIME_STDINDATA;
      }
      *pCStack_30 = m._4_4_;
    }
  }
  else {
    pcStack_48 = strdup(pcStack_20);
    if (pcStack_48 != (char *)0x0) {
      filedup = (char *)tool_mime_new((tool_mime *)filename_local,TOOLMIME_FILE);
      if ((tool_mime *)filedup == (tool_mime *)0x0) {
        free(pcStack_48);
      }
      else {
        ((tool_mime *)filedup)->data = pcStack_48;
        if ((errcode_local._7_1_ & 1) == 0) {
          ((tool_mime *)filedup)->kind = TOOLMIME_FILEDATA;
        }
        *pCStack_30 = CURLE_OK;
      }
    }
  }
  return (tool_mime *)filedup;
}

Assistant:

static struct tool_mime *tool_mime_new_filedata(struct tool_mime *parent,
                                                const char *filename,
                                                bool isremotefile,
                                                CURLcode *errcode)
{
  CURLcode result = CURLE_OK;
  struct tool_mime *m = NULL;

  *errcode = CURLE_OUT_OF_MEMORY;
  if(strcmp(filename, "-")) {
    /* This is a normal file. */
    char *filedup = strdup(filename);
    if(filedup) {
      m = tool_mime_new(parent, TOOLMIME_FILE);
      if(!m)
        free(filedup);
      else {
        m->data = filedup;
        if(!isremotefile)
          m->kind = TOOLMIME_FILEDATA;
       *errcode = CURLE_OK;
      }
    }
  }
  else {        /* Standard input. */
#ifdef UNDER_CE
    int fd = STDIN_FILENO;
#else
    int fd = fileno(stdin);
#endif
    char *data = NULL;
    curl_off_t size;
    curl_off_t origin;
    struct_stat sbuf;

    CURL_SET_BINMODE(stdin);
    origin = ftell(stdin);
    /* If stdin is a regular file, do not buffer data but read it
       when needed. */
    if(fd >= 0 && origin >= 0 && !fstat(fd, &sbuf) &&
#ifdef __VMS
       sbuf.st_fab_rfm != FAB$C_VAR && sbuf.st_fab_rfm != FAB$C_VFC &&
#endif
       S_ISREG(sbuf.st_mode)) {
      size = sbuf.st_size - origin;
      if(size < 0)
        size = 0;
    }
    else {  /* Not suitable for direct use, buffer stdin data. */
      size_t stdinsize = 0;

      switch(file2memory(&data, &stdinsize, stdin)) {
      case PARAM_NO_MEM:
        return m;
      case PARAM_READ_ERROR:
        result = CURLE_READ_ERROR;
        break;
      default:
        if(!stdinsize) {
          /* Zero-length data has been freed. Re-create it. */
          data = strdup("");
          if(!data)
            return m;
        }
        break;
      }
      size = uztoso(stdinsize);
      origin = 0;
    }
    m = tool_mime_new(parent, TOOLMIME_STDIN);
    if(!m)
      curlx_safefree(data);
    else {
      m->data = data;
      m->origin = origin;
      m->size = size;
      m->curpos = 0;
      if(!isremotefile)
        m->kind = TOOLMIME_STDINDATA;
      *errcode = result;
    }
  }
  return m;
}